

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::update(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
         *this)

{
  undefined4 uVar1;
  ITexture *pIVar2;
  uint uVar3;
  long lVar4;
  code *UNRECOVERED_JUMPTABLE;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  ECOLOR_FORMAT EVar10;
  ulong uVar11;
  ulong uVar12;
  double in_XMM0_Qa;
  
  if (this->RequestTextureUpdate == false) {
    if (this->RequestDepthStencilUpdate != true) {
      return;
    }
  }
  else {
    uVar9 = (ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_IRenderTarget).Textures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar12 = (ulong)(*(long *)&(this->super_IRenderTarget).field_0x60 -
                    *(long *)&(this->super_IRenderTarget).field_0x58) >> 2;
    uVar8 = (uint)uVar9;
    uVar3 = (uint)uVar12;
    if (uVar8 < uVar3) {
      uVar3 = uVar8;
    }
    if (uVar3 != 0) {
      uVar11 = 0;
      do {
        pIVar2 = (this->super_IRenderTarget).Textures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11];
        iVar5 = 0;
        if (pIVar2 != (ITexture *)0x0) {
          iVar5 = *(int *)&pIVar2->field_0x84;
        }
        if (iVar5 == 0) {
          lVar4 = *(long *)&(this->super_IRenderTarget).field_0x58;
          if (*(int *)(lVar4 + uVar11 * 4) != 0) {
            *(undefined4 *)(lVar4 + uVar11 * 4) = 0;
            UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
            if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
               (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
               UNRECOVERED_JUMPTABLE != (code *)0x0)) {
              in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,0,0xde1,0,0);
            }
            in_XMM0_Qa = os::Printer::log((Printer *)"Error: Could not set render target.",
                                          in_XMM0_Qa);
          }
        }
        else {
          *(int *)(*(long *)&(this->super_IRenderTarget).field_0x58 + uVar11 * 4) =
               (int)(uVar11 + 0x8ce0);
          if (pIVar2->Type == ETT_2D) {
            iVar5 = 0xde1;
          }
          else {
            iVar5 = (this->super_IRenderTarget).CubeSurfaces.m_data.
                    super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11] + 0x8515;
          }
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,uVar11 + 0x8ce0,iVar5);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
    lVar4 = *(long *)&(this->super_IRenderTarget).field_0x58;
    if (uVar3 < (uint)((ulong)(*(long *)&(this->super_IRenderTarget).field_0x60 - lVar4) >> 2)) {
      uVar9 = uVar9 & 0xffffffff;
      uVar12 = uVar12 & 0xffffffff;
      if (uVar9 < uVar12) {
        uVar12 = uVar9;
      }
      do {
        iVar5 = *(int *)(lVar4 + uVar12 * 4);
        if (iVar5 != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(0x8d40,iVar5,0xde1,0,0);
          }
          *(undefined4 *)(*(long *)&(this->super_IRenderTarget).field_0x58 + uVar12 * 4) = 0;
        }
        uVar12 = uVar12 + 1;
        lVar4 = *(long *)&(this->super_IRenderTarget).field_0x58;
      } while (uVar12 < ((ulong)(*(long *)&(this->super_IRenderTarget).field_0x60 - lVar4) >> 2 &
                        0xffffffff));
    }
    this->RequestTextureUpdate = false;
  }
  if (this->RequestDepthStencilUpdate == true) {
    pIVar2 = (this->super_IRenderTarget).DepthStencil;
    if (pIVar2 == (ITexture *)0x0) {
      EVar10 = ECF_UNKNOWN;
    }
    else {
      EVar10 = pIVar2->ColorFormat;
    }
    if (EVar10 - ECF_D16 < 3) {
      uVar1 = *(undefined4 *)&pIVar2->field_0x84;
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
      if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,uVar1,0);
      }
      if (EVar10 == ECF_D24S8) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,uVar1,0);
        }
        this->AssignedStencil = true;
      }
      else {
        if (this->AssignedStencil == true) {
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
          }
        }
        this->AssignedStencil = false;
      }
      this->AssignedDepth = true;
    }
    else {
      if (this->AssignedDepth == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,0,0);
        }
      }
      if (this->AssignedStencil == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
        }
      }
      this->AssignedDepth = false;
      this->AssignedStencil = false;
    }
    this->RequestDepthStencilUpdate = false;
  }
  if ((this->ColorAttachment == 0) || (this->BufferID == 0)) {
    return;
  }
  uVar12 = (ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->super_IRenderTarget).Textures.m_data.
                        super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar3 = (uint)uVar12;
  if (uVar3 != 1) {
    if (uVar3 == 0) {
      uVar7 = 0;
      goto LAB_001ea235;
    }
    if (this->MultipleRenderTarget != 0) {
      lVar4 = *(long *)&(this->super_IRenderTarget).field_0x58;
      uVar9 = *(long *)&(this->super_IRenderTarget).field_0x60 - lVar4;
      lVar6 = 0;
      if (uVar9 != 0) {
        lVar6 = lVar4;
      }
      uVar9 = uVar9 >> 2;
      if (uVar3 < (uint)uVar9) {
        uVar9 = uVar12;
      }
      uVar12 = uVar9 & 0xffffffff;
      if (this->MultipleRenderTarget < (uint)uVar9) {
        uVar12 = (ulong)this->MultipleRenderTarget;
      }
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b0;
      if ((UNRECOVERED_JUMPTABLE == (code *)0x0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b8,
         UNRECOVERED_JUMPTABLE == (code *)0x0)) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)(uVar12,lVar6);
      return;
    }
  }
  uVar7 = 0x8ce0;
LAB_001ea235:
  glDrawBuffer(uVar7);
  return;
}

Assistant:

void update()
	{
		if (RequestTextureUpdate || RequestDepthStencilUpdate) {
			// Set color attachments.

			if (RequestTextureUpdate) {
				// Set new color textures.

				const u32 textureSize = core::min_(Textures.size(), AssignedTextures.size());

				for (u32 i = 0; i < textureSize; ++i) {
					TOpenGLTexture *currentTexture = static_cast<TOpenGLTexture *>(Textures[i]);
					GLuint textureID = currentTexture ? currentTexture->getOpenGLTextureName() : 0;

					if (textureID != 0) {
						AssignedTextures[i] = GL_COLOR_ATTACHMENT0 + i;
						GLenum textarget = currentTexture->getType() == ETT_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP_POSITIVE_X + (int)CubeSurfaces[i];
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], textarget, textureID, 0);
#ifdef _DEBUG
						Driver->testGLError(__LINE__);
#endif
					} else if (AssignedTextures[i] != GL_NONE) {
						AssignedTextures[i] = GL_NONE;
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);

						os::Printer::log("Error: Could not set render target.", ELL_ERROR);
					}
				}

				// Reset other render target channels.

				for (u32 i = textureSize; i < AssignedTextures.size(); ++i) {
					if (AssignedTextures[i] != GL_NONE) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);
						AssignedTextures[i] = GL_NONE;
					}
				}

				RequestTextureUpdate = false;
			}

			// Set depth and stencil attachments.

			if (RequestDepthStencilUpdate) {
				const ECOLOR_FORMAT textureFormat = (DepthStencil) ? DepthStencil->getColorFormat() : ECF_UNKNOWN;

				if (IImage::isDepthFormat(textureFormat)) {
					GLuint textureID = static_cast<TOpenGLTexture *>(DepthStencil)->getOpenGLTextureName();

#ifdef _IRR_EMSCRIPTEN_PLATFORM_ // The WEBGL_depth_texture extension does not allow attaching stencil+depth separate.
					if (textureFormat == ECF_D24S8) {
						GLenum attachment = 0x821A; // GL_DEPTH_STENCIL_ATTACHMENT
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = true;
					} else {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = false;
					}
#else
					Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

					if (textureFormat == ECF_D24S8) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

						AssignedStencil = true;
					} else {
						if (AssignedStencil)
							Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

						AssignedStencil = false;
					}
#endif
					AssignedDepth = true;
				} else {
					if (AssignedDepth)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					if (AssignedStencil)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					AssignedDepth = false;
					AssignedStencil = false;
				}
#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif

				RequestDepthStencilUpdate = false;
			}

			// Configure drawing operation.

			if (ColorAttachment > 0 && BufferID != 0) {
				const u32 textureSize = Textures.size();

				if (textureSize == 0)
					Driver->irrGlDrawBuffer(GL_NONE);
				else if (textureSize == 1 || MultipleRenderTarget == 0)
					Driver->irrGlDrawBuffer(GL_COLOR_ATTACHMENT0);
				else {
					const u32 bufferCount = core::min_(MultipleRenderTarget, core::min_(textureSize, AssignedTextures.size()));

					Driver->irrGlDrawBuffers(bufferCount, AssignedTextures.pointer());
				}

#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif
			}

#ifdef _DEBUG
			checkFBO(Driver);
#endif
		}
	}